

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.cpp
# Opt level: O1

sstring_view<std::shared_ptr<const_char>_> *
pstore::make_shared_sstring_view
          (sstring_view<std::shared_ptr<const_char>_> *__return_storage_ptr__,czstring str)

{
  size_t __n;
  _func_int **__dest;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  
  __n = strlen(str);
  __dest = (_func_int **)operator_new__(__n);
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00199c98;
  this[1]._vptr__Sp_counted_base = __dest;
  if (__n != 0) {
    memcpy(__dest,str,__n);
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
  }
  (__return_storage_ptr__->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__dest;
  (__return_storage_ptr__->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = this;
  __return_storage_ptr__->size_ = __n;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  return __return_storage_ptr__;
}

Assistant:

sstring_view<std::shared_ptr<char const>> make_shared_sstring_view (gsl::czstring const str) {
        auto const length = std::strlen (str);
        auto const ptr =
            std::shared_ptr<char> (new char[length], [] (gsl::czstring const p) { delete[] p; });
        std::copy (str, str + length, ptr.get ());
        return pstore::make_shared_sstring_view (std::static_pointer_cast<char const> (ptr),
                                                 length);
    }